

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_nop_zeropage_x_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1eb03e::NopZeroXFixture_nop_zerox_Test::NopZeroXFixture_nop_zerox_Test
          (NopZeroXFixture_nop_zerox_Test *this)

{
  NopZeroXFixture_nop_zerox_Test *this_local;
  
  NopZeroXFixture::NopZeroXFixture(&this->super_NopZeroXFixture);
  (this->super_NopZeroXFixture).super_CpuTest.super_Test._vptr_Test =
       (_func_int **)&PTR__NopZeroXFixture_nop_zerox_Test_003f3e48;
  (this->super_NopZeroXFixture).super_WithParamInterface<unsigned_char>._vptr_WithParamInterface =
       (_func_int **)&DAT_003f3e88;
  return;
}

Assistant:

TEST_P(NopZeroXFixture, nop_zerox) {
    stage_instruction(GetParam());
    expected.x = registers.x = 0x01;
    expected.pc += 1;
    EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(0xCD));
    EXPECT_CALL(mmu, read_byte(0xCD)).WillOnce(Return(0xFD)); // Dummy read

    step_execution(4);
    EXPECT_EQ(expected, registers);
}